

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_exif.cc
# Opt level: O1

string * core::image::anon_unknown_0::debug_print(string *__return_storage_ptr__,string *value)

{
  size_type sVar1;
  pointer pcVar2;
  
  sVar1 = value->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"<not set>","")
    ;
  }
  else {
    pcVar2 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    debug_print (std::string const& value)
    {
        if (value.empty())
            return "<not set>";
        else
            return value;
    }